

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O1

string * __thiscall
sockpp::inet6_address::to_string_abi_cxx11_(string *__return_storage_ptr__,inet6_address *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  ushort uVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  uint __val;
  char cVar9;
  ulong uVar10;
  ulong uVar11;
  char *__s;
  string __str;
  char buf [46];
  ulong *local_108;
  uint local_100;
  undefined4 uStack_fc;
  ulong local_f8 [2];
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  char local_68 [56];
  
  pcVar4 = inet_ntop(10,&(this->addr_).sin6_addr,local_68,0x2e);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"[","");
  __s = "<unknown>";
  if (pcVar4 != (char *)0x0) {
    __s = pcVar4;
  }
  local_a8 = local_98;
  sVar5 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,__s,__s + sVar5);
  uVar10 = 0xf;
  if (local_88 != local_78) {
    uVar10 = local_78[0];
  }
  if (uVar10 < (ulong)(local_a0 + local_80)) {
    uVar10 = 0xf;
    if (local_a8 != local_98) {
      uVar10 = local_98[0];
    }
    if (uVar10 < (ulong)(local_a0 + local_80)) goto LAB_00107bd2;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_88);
  }
  else {
LAB_00107bd2:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8);
  }
  local_e8 = &local_d8;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_d8 = *plVar7;
    uStack_d0 = puVar6[3];
  }
  else {
    local_d8 = *plVar7;
    local_e8 = (long *)*puVar6;
  }
  local_e0 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar8) {
    local_b8 = *puVar8;
    lStack_b0 = plVar7[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar8;
    local_c8 = (ulong *)*plVar7;
  }
  local_c0 = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar3 = (this->addr_).sin6_port;
  uVar3 = uVar3 << 8 | uVar3 >> 8;
  __val = (uint)uVar3;
  cVar9 = '\x01';
  if (((9 < uVar3) && (cVar9 = '\x02', 99 < uVar3)) && (cVar9 = '\x03', 999 < __val)) {
    cVar9 = '\x05' - (__val < 10000);
  }
  local_108 = local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_108,local_100,__val);
  uVar10 = CONCAT44(uStack_fc,local_100) + local_c0;
  uVar11 = 0xf;
  if (local_c8 != &local_b8) {
    uVar11 = local_b8;
  }
  if (uVar11 < uVar10) {
    uVar11 = 0xf;
    if (local_108 != local_f8) {
      uVar11 = local_f8[0];
    }
    if (uVar10 <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
      goto LAB_00107d4c;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_108);
LAB_00107d4c:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar2 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string inet6_address::to_string() const {
    char buf[INET6_ADDRSTRLEN];
    auto str = inet_ntop(AF_INET6, (void*)&(addr_.sin6_addr), buf, INET6_ADDRSTRLEN);
    return string("[") + string(str ? str : "<unknown>") +
           "]:" + std::to_string(unsigned(port()));
}